

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

void Edg_ManToMapping(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  int *piVar3;
  int Id;
  long lVar4;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x294,"void Edg_ManToMapping(Gia_Man_t *)");
  }
  Vec_WecFreeP(&p->vMapping2);
  Vec_WecFreeP(&p->vFanouts2);
  pVVar2 = Vec_WecStart(p->nObjs);
  p->vMapping2 = pVVar2;
  pVVar2 = Vec_WecStart(p->nObjs);
  p->vFanouts2 = pVVar2;
  Id = 1;
  do {
    if (p->nObjs <= Id) {
      return;
    }
    iVar1 = Gia_ObjIsLut(p,Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p,Id);
      if (4 < iVar1) {
        __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x29b,"void Edg_ManToMapping(Gia_Man_t *)");
      }
      lVar4 = 0;
      while( true ) {
        iVar1 = Gia_ObjLutSize(p,Id);
        if (iVar1 <= lVar4) break;
        piVar3 = Gia_ObjLutFanins(p,Id);
        iVar1 = piVar3[lVar4];
        Vec_WecPush(p->vMapping2,Id,iVar1);
        Vec_WecPush(p->vFanouts2,iVar1,Id);
        lVar4 = lVar4 + 1;
      }
    }
    Id = Id + 1;
  } while( true );
}

Assistant:

void Edg_ManToMapping( Gia_Man_t * p )
{
    int iObj, iFanin, k;
    assert( Gia_ManHasMapping(p) );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    p->vMapping2 = Vec_WecStart( Gia_ManObjNum(p) );
    p->vFanouts2 = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            Vec_WecPush( p->vMapping2, iObj, iFanin );
            Vec_WecPush( p->vFanouts2, iFanin, iObj );
        }
    }
}